

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall
Js::ParseableFunctionInfo::SetSourceInfo
          (ParseableFunctionInfo *this,uint sourceIndex,ParseNodeFnc *node,bool isEval,
          bool isDynamicFunction)

{
  code *pcVar1;
  bool bVar2;
  charcount_t cVar3;
  uint uVar4;
  charcount_t cVar5;
  BOOL BVar6;
  undefined4 *puVar7;
  Recycler *pRVar8;
  PrintOffsets *offsets;
  Utf8SourceInfo **ppUVar9;
  size_t sVar10;
  FunctionInfo *this_00;
  FunctionBody *pFVar11;
  FunctionBody *functionBody;
  TrackAllocData local_68;
  PrintOffsets *local_40;
  PrintOffsets *printOffsets;
  size_t lengthInBytes;
  size_t cbMin;
  bool isDynamicFunction_local;
  ParseNodeFnc *pPStack_20;
  bool isEval_local;
  ParseNodeFnc *node_local;
  ParseableFunctionInfo *pPStack_10;
  uint sourceIndex_local;
  ParseableFunctionInfo *this_local;
  
  cbMin._6_1_ = isDynamicFunction;
  cbMin._7_1_ = isEval;
  pPStack_20 = node;
  node_local._4_4_ = sourceIndex;
  pPStack_10 = this;
  if ((char)(this->super_FunctionProxy).field_0x47 < '\0') {
    if (this->m_sourceIndex != sourceIndex) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0xb87,"(this->m_sourceIndex == sourceIndex)",
                                  "Mismatched source index");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    bVar2 = GetIsGlobalFunc(this);
    if (!bVar2) {
      uVar4 = StartOffset(this);
      if ((ulong)uVar4 != pPStack_20->cbMin) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                    ,0xb8c,"(this->StartOffset() == node->cbMin)",
                                    "Mismatched source start offset");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      if (this->m_cchStartOffset != (pPStack_20->super_ParseNode).ichMin) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                    ,0xb8d,"(this->m_cchStartOffset == node->ichMin)",
                                    "Mismatched source character start offset");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      cVar3 = this->m_cchLength;
      cVar5 = ParseNode::LengthInCodepoints(&pPStack_20->super_ParseNode);
      if (cVar3 != cVar5) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                    ,0xb8e,"(this->m_cchLength == node->LengthInCodepoints())",
                                    "Mismatched source length");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      uVar4 = LengthInBytes(this);
      sVar10 = ParseNodeFnc::LengthInBytes(pPStack_20);
      if (uVar4 != sVar10) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                    ,0xb8f,"(this->LengthInBytes() == node->LengthInBytes())",
                                    "Mismatched source encoded byte length");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
    }
    if (((this->super_FunctionProxy).field_0x47 & 1) != (cbMin._7_1_ & 1)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0xb92,"(this->m_isEval == isEval)","Mismatched source type");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    if (((byte)(this->super_FunctionProxy).field_0x47 >> 1 & 1) != (cbMin._6_1_ & 1)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0xb93,"(this->m_isDynamicFunction == isDynamicFunction)",
                                  "Mismatch source type");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
  }
  else {
    this->m_sourceIndex = sourceIndex;
    this->m_cchStartOffset = (node->super_ParseNode).ichMin;
    cVar3 = ParseNode::LengthInCodepoints(&node->super_ParseNode);
    this->m_cchLength = cVar3;
    this->m_lineNumber = pPStack_20->lineNumber;
    this->m_columnNumber = pPStack_20->columnNumber;
    (this->super_FunctionProxy).field_0x47 =
         (this->super_FunctionProxy).field_0x47 & 0xfe | cbMin._7_1_ & 1;
    (this->super_FunctionProxy).field_0x47 =
         (this->super_FunctionProxy).field_0x47 & 0xfd | (cbMin._6_1_ & 1) << 1;
    lengthInBytes = pPStack_20->cbMin;
    printOffsets = (PrintOffsets *)ParseNodeFnc::LengthInBytes(pPStack_20);
    if ((0xffffffff < lengthInBytes) || ((PrintOffsets *)0xffffffff < printOffsets)) {
      Throw::OutOfMemory();
    }
    if (pPStack_20->cbMin < pPStack_20->cbStringMin) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0xb70,"(node->cbStringMin <= node->cbMin)",
                                  "node->cbStringMin <= node->cbMin");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    this->m_cbStartOffset = (Type)lengthInBytes;
    this->m_cbLength = (Type)printOffsets;
    if (pPStack_20->cbStringMin != pPStack_20->cbMin) {
      pRVar8 = ScriptContext::GetRecycler((this->super_FunctionProxy).m_scriptContext);
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_68,(type_info *)&PrintOffsets::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                 ,0xb76);
      pRVar8 = Memory::Recycler::TrackAllocInfo(pRVar8,&local_68);
      offsets = (PrintOffsets *)new<Memory::Recycler>(8,pRVar8,0xa38830);
      memset(offsets,0,8);
      offsets->cbStartPrintOffset = (uint)pPStack_20->cbStringMin;
      offsets->cbEndPrintOffset = (uint)pPStack_20->cbStringLim;
      local_40 = offsets;
      SetPrintOffsets(this,offsets);
    }
    ppUVar9 = Memory::WriteBarrierPtr::operator_cast_to_Utf8SourceInfo__
                        ((WriteBarrierPtr *)&(this->super_FunctionProxy).m_utf8SourceInfo);
    if (*ppUVar9 == (Utf8SourceInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0xb7c,"(this->m_utf8SourceInfo != nullptr)",
                                  "this->m_utf8SourceInfo != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    (this->super_FunctionProxy).field_0x47 = (this->super_FunctionProxy).field_0x47 & 0x7f | 0x80;
    bVar2 = FunctionProxy::IsFunctionBody(&this->super_FunctionProxy);
    if (bVar2) {
      pFVar11 = FunctionProxy::GetFunctionBody(&this->super_FunctionProxy);
      FunctionBody::FinishSourceInfo(pFVar11);
    }
  }
  bVar2 = Phases::IsEnabled((Phases *)&DAT_01ec1678,FunctionSourceInfoParsePhase);
  if (bVar2) {
    this_00 = FunctionProxy::GetFunctionInfo(&this->super_FunctionProxy);
    BVar6 = FunctionInfo::HasBody(this_00);
    if (BVar6 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0xb9a,"(this->GetFunctionInfo()->HasBody())",
                                  "this->GetFunctionInfo()->HasBody()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    bVar2 = FunctionProxy::IsFunctionBody(&this->super_FunctionProxy);
    if (bVar2) {
      pFVar11 = FunctionProxy::GetFunctionBody(&this->super_FunctionProxy);
      if (pFVar11 == (FunctionBody *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                    ,0xb9e,"(functionBody != nullptr)","functionBody != nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      cVar3 = StartInDocument(&pFVar11->super_ParseableFunctionInfo);
      FunctionBody::PrintStatementSourceLineFromStartOffset(pFVar11,cVar3);
      Output::Flush();
    }
  }
  return;
}

Assistant:

void ParseableFunctionInfo::SetSourceInfo(uint sourceIndex, ParseNodeFnc * node, bool isEval, bool isDynamicFunction)
    {
        if (!m_utf8SourceHasBeenSet)
        {
            this->m_sourceIndex = sourceIndex;
            this->m_cchStartOffset = node->ichMin;
            this->m_cchLength = node->LengthInCodepoints();
            this->m_lineNumber = node->lineNumber;
            this->m_columnNumber = node->columnNumber;
            this->m_isEval = isEval;
            this->m_isDynamicFunction = isDynamicFunction;

            // It would have been better if we detect and reject large source buffer earlier before parsing
            size_t cbMin = node->cbMin;
            size_t lengthInBytes = node->LengthInBytes();
            if (cbMin > UINT_MAX || lengthInBytes > UINT_MAX)
            {
                Js::Throw::OutOfMemory();
            }
            Assert(node->cbStringMin <= node->cbMin);
            this->m_cbStartOffset = (uint)cbMin;
            this->m_cbLength = (uint)lengthInBytes;

            if (node->cbStringMin != node->cbMin)
            {
                PrintOffsets* printOffsets = RecyclerNewLeaf(this->m_scriptContext->GetRecycler(), PrintOffsets);
                printOffsets->cbStartPrintOffset = (uint)node->cbStringMin;
                printOffsets->cbEndPrintOffset = (uint)node->cbStringLim;
                this->SetPrintOffsets(printOffsets);
            }

            Assert(this->m_utf8SourceInfo != nullptr);
            this->m_utf8SourceHasBeenSet = true;

            if (this->IsFunctionBody())
            {
                this->GetFunctionBody()->FinishSourceInfo();
            }
        }
#if DBG
        else
        {
            AssertMsg(this->m_sourceIndex == sourceIndex, "Mismatched source index");
            if (!this->GetIsGlobalFunc())
            {
                // In the global function case with a @cc_on, we modify some of these values so it might
                // not match on reparse (see ParseableFunctionInfo::Parse()).
                AssertMsg(this->StartOffset() == node->cbMin, "Mismatched source start offset");
                AssertMsg(this->m_cchStartOffset == node->ichMin, "Mismatched source character start offset");
                AssertMsg(this->m_cchLength == node->LengthInCodepoints(), "Mismatched source length");
                AssertMsg(this->LengthInBytes() == node->LengthInBytes(), "Mismatched source encoded byte length");
            }

            AssertMsg(this->m_isEval == isEval, "Mismatched source type");
            AssertMsg(this->m_isDynamicFunction == isDynamicFunction, "Mismatch source type");
       }
#endif

#if DBG_DUMP
        if (PHASE_TRACE1(Js::FunctionSourceInfoParsePhase))
        {
            Assert(this->GetFunctionInfo()->HasBody());
            if (this->IsFunctionBody())
            {
                FunctionBody* functionBody = this->GetFunctionBody();
                Assert( functionBody != nullptr );

                functionBody->PrintStatementSourceLineFromStartOffset(functionBody->StartInDocument());
                Output::Flush();
            }
        }
#endif
    }